

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O3

void __thiscall
cbtIDebugDraw::drawAabb(cbtIDebugDraw *this,cbtVector3 *from,cbtVector3 *to,cbtVector3 *color)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  float fVar10;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_9c;
  float local_98;
  float local_94;
  long local_90;
  undefined8 local_88;
  float local_80;
  undefined4 local_7c;
  undefined8 local_78;
  float local_70;
  undefined4 local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar1 = *(ulong *)from->m_floats;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1;
  local_90 = 0;
  fVar10 = (to->m_floats[2] - from->m_floats[2]) * 0.5;
  uVar2 = *(ulong *)to->m_floats;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  local_80 = (to->m_floats[2] + from->m_floats[2]) * 0.5;
  local_98 = fVar10;
  local_9c = local_80;
  auVar6 = vsubps_avx(auVar6,auVar8);
  local_b8 = 0x3f8000003f800000;
  uStack_b0 = 0x3f800000;
  local_58._0_4_ = auVar6._0_4_ * 0.5;
  local_58._4_4_ = auVar6._4_4_ * 0.5;
  local_58._8_4_ = auVar6._8_4_ * 0.5;
  local_58._12_4_ = auVar6._12_4_ * 0.5;
  auVar9 = ZEXT1664(local_58);
  local_68._0_4_ = ((float)uVar2 + (float)uVar1) * 0.5;
  local_68._4_4_ = ((float)(uVar2 >> 0x20) + (float)(uVar1 >> 0x20)) * 0.5;
  local_68._8_8_ = 0;
  auVar7 = ZEXT1664(local_68);
  while( true ) {
    uStack_40._0_4_ = 0.0;
    uStack_40._4_4_ = 0.0;
    lVar3 = 0;
    local_94 = (float)uStack_b0;
    local_48._0_4_ = (float)local_b8;
    local_48._4_4_ = local_b8._4_4_;
    do {
      local_6c = 0;
      local_7c = 0;
      auVar4._0_4_ = auVar7._0_4_ + auVar9._0_4_ * (float)local_48;
      auVar4._4_4_ = auVar7._4_4_ + auVar9._4_4_ * local_48._4_4_;
      auVar4._8_4_ = auVar7._8_4_ + auVar9._8_4_ * (float)uStack_40;
      auVar4._12_4_ = auVar7._12_4_ + auVar9._12_4_ * uStack_40._4_4_;
      local_70 = local_80 + fVar10 * local_94;
      local_78 = vmovlps_avx(auVar4);
      *(uint *)((long)&local_b8 + lVar3 * 4) = *(uint *)((long)&local_b8 + lVar3 * 4) ^ 0x80000000;
      local_48 = local_b8;
      uStack_40 = 0;
      local_94 = (float)uStack_b0;
      auVar5._0_4_ = auVar7._0_4_ + auVar9._0_4_ * (float)local_b8;
      auVar5._4_4_ = auVar7._4_4_ + auVar9._4_4_ * (float)((ulong)local_b8 >> 0x20);
      auVar5._8_4_ = auVar7._8_4_ + auVar9._8_4_ * 0.0;
      auVar5._12_4_ = auVar7._12_4_ + auVar9._12_4_ * 0.0;
      local_80 = local_80 + fVar10 * (float)uStack_b0;
      local_88 = vmovlps_avx(auVar5);
      (*this->_vptr_cbtIDebugDraw[4])(this,&local_78,&local_88,color);
      fVar10 = local_98;
      local_80 = local_9c;
      auVar7 = ZEXT1664(local_68);
      auVar9 = ZEXT1664(local_58);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_b8 = 0xbf800000bf800000;
    uStack_b0 = 0xbf800000;
    if (local_90 == 3) break;
    *(uint *)((long)&local_b8 + local_90 * 4) =
         *(uint *)((long)&local_b8 + local_90 * 4) ^ 0x80000000;
    local_90 = local_90 + 1;
  }
  return;
}

Assistant:

virtual void drawAabb(const cbtVector3& from, const cbtVector3& to, const cbtVector3& color)
	{
		cbtVector3 halfExtents = (to - from) * 0.5f;
		cbtVector3 center = (to + from) * 0.5f;
		int i, j;

		cbtVector3 edgecoord(1.f, 1.f, 1.f), pa, pb;
		for (i = 0; i < 4; i++)
		{
			for (j = 0; j < 3; j++)
			{
				pa = cbtVector3(edgecoord[0] * halfExtents[0], edgecoord[1] * halfExtents[1],
							   edgecoord[2] * halfExtents[2]);
				pa += center;

				int othercoord = j % 3;
				edgecoord[othercoord] *= -1.f;
				pb = cbtVector3(edgecoord[0] * halfExtents[0], edgecoord[1] * halfExtents[1],
							   edgecoord[2] * halfExtents[2]);
				pb += center;

				drawLine(pa, pb, color);
			}
			edgecoord = cbtVector3(-1.f, -1.f, -1.f);
			if (i < 3)
				edgecoord[i] *= -1.f;
		}
	}